

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O3

void __thiscall StackTrace::push_stack_element(StackTrace *this,size_t element)

{
  StoredVertexList *this_00;
  size_t *psVar1;
  __int_type_conflict _Var2;
  pointer psVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  pointer psVar6;
  _List_node_base *p_Var7;
  int spin_count;
  uint uVar8;
  _List_node_base *p_Var9;
  pair<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_bool>
  pVar10;
  back_insertion_sequence_tag local_70;
  stored_vertex local_68;
  
  uVar8 = 0;
  do {
    if (((this->lock)._locked._M_base._M_i & 1U) == 0) {
      LOCK();
      _Var2 = (this->lock)._locked._M_base._M_i;
      (this->lock)._locked._M_base._M_i = true;
      UNLOCK();
      if ((_Var2 & 1U) == 0) break;
    }
    if (0xf < uVar8) {
      sched_yield();
    }
    uVar8 = uVar8 + 1;
  } while( true );
  psVar3 = (this->_local_stack).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (psVar6 = *(pointer *)
                 &psVar3[this->_ce].super_StoredVertex.m_in_edges.
                  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                  ._M_impl;
      *(pointer *)
       ((long)&psVar3[this->_ce].super_StoredVertex.m_in_edges.
               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
       + 8) != psVar6; psVar6 = psVar6 + 1) {
    p_Var9 = (_List_node_base *)(psVar6->super_stored_edge<unsigned_long>).m_target;
    if (psVar3[(long)p_Var9].super_StoredVertex.m_property.addr == element) goto LAB_0010c3f8;
  }
  this_00 = &(this->_local_stack).super_type.m_vertices;
  local_68.super_StoredVertex.m_in_edges.
  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super_StoredVertex.m_in_edges.
  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super_StoredVertex.m_out_edges.
  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super_StoredVertex.m_in_edges.
  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super_StoredVertex.m_out_edges.
  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super_StoredVertex.m_out_edges.
  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super_StoredVertex.m_property.addr = element;
  std::
  vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config::stored_vertex,std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config::stored_vertex>>
  ::
  emplace_back<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config::stored_vertex>
            ((vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config::stored_vertex,std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config::stored_vertex>>
              *)this_00,&local_68);
  if (local_68.super_StoredVertex.m_in_edges.
      super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super_StoredVertex.m_in_edges.
                    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super_StoredVertex.m_in_edges.
                          super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super_StoredVertex.m_in_edges.
                          super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super_StoredVertex.m_out_edges.
      super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super_StoredVertex.m_out_edges.
                          super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super_StoredVertex.m_out_edges.
                          super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  p_Var4 = (_List_node_base *)this->_ce;
  p_Var7 = (_List_node_base *)
           (((long)(this->_local_stack).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_local_stack).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  p_Var9 = (_List_node_base *)((long)&p_Var7[-1]._M_prev + 7);
  p_Var5 = p_Var4;
  if (p_Var4 < p_Var9) {
    p_Var5 = p_Var9;
  }
  if (p_Var7 <= p_Var5) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,(size_type)((long)&p_Var5->_M_next + 1));
  }
  p_Var5 = (_List_node_base *)operator_new(0x28);
  p_Var5[1]._M_next = p_Var9;
  p_Var5[1]._M_prev = p_Var4;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->_local_stack).super_type.m_edges.
            super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var5 = *(_List_node_base **)
            ((long)&(this->_local_stack).super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node.super__List_node_base + 8);
  local_70 = (back_insertion_sequence_tag)_DYNAMIC;
  local_68.super_StoredVertex.m_out_edges.
  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var4;
  local_68.super_StoredVertex.m_out_edges.
  super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var5;
  pVar10 = boost::graph_detail::
           push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                     ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       *)((this->_local_stack).super_type.m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)p_Var9),
                      (stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>
                       *)&local_68,&local_70);
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar1 = &(this->_local_stack).super_type.m_edges.
              super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var5,0x28);
  }
  else {
    local_70 = (back_insertion_sequence_tag)_DYNAMIC;
    local_68.super_StoredVertex.m_out_edges.
    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var9;
    local_68.super_StoredVertex.m_out_edges.
    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var5;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((long)(this_00->
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         )._M_impl.super__Vector_impl_data._M_start + (long)p_Var4 * 0x38 + 0x18),
               (stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>
                *)&local_68,&local_70);
  }
LAB_0010c3f8:
  this->_ce = (vertex_descriptor)p_Var9;
  (this->lock)._locked._M_base._M_i = false;
  return;
}

Assistant:

void StackTrace::push_stack_element(size_t element) {
  std::lock_guard<ipc::spinlock> lg(lock);
  StackTree::vertex_descriptor tmp;

  if (boost::in_degree(_ce, _local_stack) > 0) {
    auto in_edges = boost::in_edges(_ce, _local_stack);
    for (auto it = in_edges.first; it != in_edges.second; ++it) {
      // check here if such a node is already existant and use it if so
      tmp = boost::source(*it, _local_stack);
      auto desc = _local_stack[tmp].addr;

      if (element == desc) {
        _ce = tmp;  // node is already there, use it
        return;
      }
    }
  }

  tmp = boost::add_vertex({element}, _local_stack);
  boost::add_edge(tmp, _ce, _local_stack);
  _ce = tmp;
}